

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall CLI::App::run_callback(App *this,bool final_mode,bool suppress_final_callback)

{
  pointer psVar1;
  App *this_00;
  size_t sVar2;
  undefined7 in_register_00000031;
  pointer ppAVar3;
  shared_ptr<CLI::App> *subc;
  pointer psVar4;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_40;
  
  (*this->_vptr_App[2])();
  if (((int)CONCAT71(in_register_00000031,final_mode) == 0) &&
     ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->parse_complete_callback_)._M_invoker)((_Any_data *)&this->parse_complete_callback_);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_40,&this->parsed_subcommands_)
  ;
  for (ppAVar3 = local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar3 !=
      local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
    if ((*ppAVar3)->parent_ == this) {
      run_callback(*ppAVar3,true,suppress_final_callback);
    }
  }
  if (local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    this_00 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((this_00->name_)._M_string_length == 0) && (sVar2 = count_all(this_00), sVar2 != 0)) {
      run_callback((psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,true,
                   suppress_final_callback);
    }
  }
  if ((this->parsed_ != 0 &&
      (this->final_callback_).super__Function_base._M_manager != (_Manager_type)0x0) &&
      !suppress_final_callback) {
    if ((this->name_)._M_string_length == 0) {
      sVar2 = count_all(this);
      if ((sVar2 == 0) && (this->parent_ != (App *)0x0)) {
        return;
      }
      if ((this->final_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
    }
    (*(this->final_callback_)._M_invoker)((_Any_data *)&this->final_callback_);
  }
  return;
}

Assistant:

void run_callback(bool final_mode = false, bool suppress_final_callback = false) {
        pre_callback();
        // in the main app if immediate_callback_ is set it runs the main callback before the used subcommands
        if(!final_mode && parse_complete_callback_) {
            parse_complete_callback_();
        }
        // run the callbacks for the received subcommands
        for(App *subc : get_subcommands()) {
            if(subc->parent_ == this) {
                subc->run_callback(true, suppress_final_callback);
            }
        }
        // now run callbacks for option_groups
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && subc->count_all() > 0) {
                subc->run_callback(true, suppress_final_callback);
            }
        }

        // finally run the main callback
        if(final_callback_ && (parsed_ > 0) && (!suppress_final_callback)) {
            if(!name_.empty() || count_all() > 0 || parent_ == nullptr) {
                final_callback_();
            }
        }
    }